

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

void __thiscall FileInputSource::FileInputSource(FileInputSource *this,char *filename)

{
  char *__s;
  FILE *pFVar1;
  allocator<char> local_19;
  char *local_18;
  char *filename_local;
  FileInputSource *this_local;
  
  local_18 = filename;
  filename_local = (char *)this;
  InputSource::InputSource(&this->super_InputSource);
  __s = local_18;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__FileInputSource_0058cbc8;
  this->close_file = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->filename,__s,&local_19);
  std::allocator<char>::~allocator(&local_19);
  pFVar1 = QUtil::safe_fopen(local_18,"rb");
  this->file = pFVar1;
  return;
}

Assistant:

FileInputSource::FileInputSource(char const* filename) :
    close_file(true),
    filename(filename),
    file(QUtil::safe_fopen(filename, "rb"))
{
}